

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall QGridLayout::setRowStretch(QGridLayout *this,int row,int stretch)

{
  QGridLayoutPrivate::setRowStretch
            (*(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8,row,stretch);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QGridLayout::setRowStretch(int row, int stretch)
{
    Q_D(QGridLayout);
    d->setRowStretch(row, stretch);
    invalidate();
}